

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

void __thiscall Fossilize::StreamArchive::resolve_path(StreamArchive *this,string *read_only_part)

{
  string *this_00;
  char cVar1;
  int iVar2;
  char cmpstr [11];
  string local_60;
  string local_40;
  
  this_00 = &this->path;
  iVar2 = std::__cxx11::string::compare((ulong)this_00,0,(char *)0xa);
  if (((iVar2 == 0) && (10 < (this->path)._M_string_length)) &&
     ((cVar1 = (this_00->_M_dataplus)._M_p[10], cVar1 == '\\' || (cVar1 == '/')))) {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)this_00);
    Path::relpath(&local_40,read_only_part,&local_60);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_40);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

void resolve_path(const std::string &read_only_part)
	{
		constexpr char cmpstr[] = "$bucketdir";
		constexpr size_t offset = sizeof(cmpstr) - 1;
		if (path.compare(0, offset, cmpstr) == 0 &&
		    path.size() > offset &&
		    (path[offset] == '/' || path[offset] == '\\'))
		{
			path = Path::relpath(read_only_part, path.substr(offset + 1));
		}
	}